

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept_mdapi.cpp
# Opt level: O1

void __thiscall CLIntercept::reportMDAPICounters(CLIntercept *this,ostream *os)

{
  long lVar1;
  long lVar2;
  char cVar3;
  _Base_ptr p_Var4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  _Base_ptr *pp_Var7;
  long lVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> headerWidths;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string header;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  _Rb_tree_node_base *local_58;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  if ((((this->m_Config).DevicePerfCounterTiming == true) &&
      ((this->m_Config).DevicePerfCounterEventBasedSampling == true)) &&
     ((this->m_MetricAggregations)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    local_50 = local_40;
    local_48 = 0;
    local_40[0] = '\0';
    local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    p_Var6 = (this->m_MetricAggregations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var4 = p_Var6[2]._M_right;
    pp_Var7 = &p_Var6[2]._M_parent;
    if (p_Var4 != (_Base_ptr)pp_Var7) {
      do {
        local_78[0] = local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_78,*(long *)(p_Var4 + 1),
                   (long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1));
        std::__cxx11::string::append((char *)local_78);
        std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_78[0]);
        if (local_78[0] != local_68) {
          operator_delete(local_78[0]);
        }
        local_78[0] = (undefined1 *)CONCAT44(local_78[0]._4_4_,*(uint *)&p_Var4[1]._M_parent);
        if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_98,
                     (iterator)
                     local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)local_78);
        }
        else {
          *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = *(uint *)&p_Var4[1]._M_parent;
          local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while (p_Var4 != (_Base_ptr)pp_Var7);
    }
    cVar3 = (char)os;
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
    std::ostream::put(cVar3);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Device Performance Counter Timing: (Average metric per enqueue)",0x3f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"                                FunctionName,  Calls, ",0x36);
    std::__ostream_insert<char,std::char_traits<char>>(os,local_50,local_48);
    p_Var6 = (this->m_MetricAggregations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var6 !=
           &(this->m_MetricAggregations)._M_t._M_impl.super__Rb_tree_header) {
      std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
      std::ostream::put(cVar3);
      poVar5 = (ostream *)std::ostream::flush();
      lVar8 = *(long *)poVar5;
      lVar1 = *(long *)(lVar8 + -0x18);
      *(uint *)(poVar5 + lVar1 + 0x18) = *(uint *)(poVar5 + lVar1 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar5 + *(long *)(lVar8 + -0x18) + 0x10) = 0x2c;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      lVar8 = *(long *)os;
      lVar1 = *(long *)(lVar8 + -0x18);
      *(uint *)(os + lVar1 + 0x18) = *(uint *)(os + lVar1 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(os + *(long *)(lVar8 + -0x18) + 0x10) = 6;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      p_Var4 = p_Var6[2]._M_right;
      local_58 = p_Var6;
      if (p_Var4 != (_Base_ptr)&p_Var6[2]._M_parent) {
        lVar8 = 0;
        do {
          lVar1 = *(long *)os;
          lVar2 = *(long *)(lVar1 + -0x18);
          *(uint *)(os + lVar2 + 0x18) = *(uint *)(os + lVar2 + 0x18) & 0xffffff4f | 0x80;
          *(long *)(os + *(long *)(lVar1 + -0x18) + 0x10) =
               (long)*(int *)((long)local_98.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar8);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
          lVar8 = lVar8 + 4;
        } while (p_Var4 != (_Base_ptr)&p_Var6[2]._M_parent);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(local_58);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  return;
}

Assistant:

void CLIntercept::reportMDAPICounters( std::ostream& os )
{
    if( config().DevicePerfCounterTiming &&
        config().DevicePerfCounterEventBasedSampling &&
        !m_MetricAggregations.empty() )
    {
        std::string header;
        std::vector<uint32_t> headerWidths;
        for( auto& metric : m_MetricAggregations.begin()->second )
        {
            const std::string& metricName = metric.first;

            header += metricName + ", ";
            headerWidths.push_back((uint32_t)metricName.length());
        }

        os << std::endl << "Device Performance Counter Timing: (Average metric per enqueue)" << std::endl;
        os << "                                FunctionName,  Calls, " << header;

        for( auto& metricsForKernel : m_MetricAggregations )
        {
            const std::string& kernelName = metricsForKernel.first;
            const MetricsDiscovery::CMetricAggregationsForKernel& kernelMetrics = metricsForKernel.second;

            uint64_t count = kernelMetrics.begin()->second.Count;
            os << std::endl << std::right << std::setw( 44 ) << kernelName << ", ";
            os << std::right << std::setw( 6 ) << count << ", ";

            int numMetric = 0;
            for( auto& metric : kernelMetrics )
            {
                const MetricsDiscovery::SMetricAggregationData& aggregationData = metric.second;
                os << std::right << std::setw( headerWidths[ numMetric++ ] );
                os << aggregationData.Sum / aggregationData.Count << ", ";
            }
        }

        os << std::endl;
    }
}